

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curve.h
# Opt level: O0

Ref<anurbs::NurbsCurveGeometry<3L>_> __thiscall
anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::curve_geometry
          (Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Ref<anurbs::NurbsCurveGeometry<3L>_> RVar1;
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *this_local;
  
  Ref<anurbs::NurbsCurveGeometry<3L>_>::Ref
            ((Ref<anurbs::NurbsCurveGeometry<3L>_> *)this,
             (Ref<anurbs::NurbsCurveGeometry<3L>_> *)(in_RSI + 8));
  RVar1.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::NurbsCurveGeometry<3L>_>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

TRef curve_geometry() const
    {
        return m_curve_geometry;
    }